

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::Options::add_to_option(Options *this,string *option,string *arg)

{
  bool bVar1;
  option_not_exists_exception *this_00;
  pointer ppVar2;
  shared_ptr<cxxopts::OptionDetails> local_50 [2];
  _Self local_30;
  _Self local_28;
  iterator iter;
  string *arg_local;
  string *option_local;
  Options *this_local;
  
  iter._M_node = (_Base_ptr)arg;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::find(&this->m_options,option);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::end(&this->m_options);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>
             ::operator->(&local_28);
    std::shared_ptr<cxxopts::OptionDetails>::shared_ptr(local_50,&ppVar2->second);
    parse_option(this,local_50,option,(string *)iter._M_node);
    std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr(local_50);
    return;
  }
  this_00 = (option_not_exists_exception *)__cxa_allocate_exception(0x28);
  option_not_exists_exception::option_not_exists_exception(this_00,option);
  __cxa_throw(this_00,&option_not_exists_exception::typeinfo,
              option_not_exists_exception::~option_not_exists_exception);
}

Assistant:

void
Options::add_to_option(const std::string& option, const std::string& arg)
{
  auto iter = m_options.find(option);

  if (iter == m_options.end())
  {
    throw option_not_exists_exception(option);
  }

  parse_option(iter->second, option, arg);
}